

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O3

bool cppwinrt::operator==(type_name *left,type_name *right)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = (left->name)._M_len;
  if (sVar1 != (right->name)._M_len) {
    return false;
  }
  if ((((sVar1 == 0) || (iVar2 = bcmp((left->name)._M_str,(right->name)._M_str,sVar1), iVar2 == 0))
      && (sVar1 = (left->name_space)._M_len, sVar1 == (right->name_space)._M_len)) &&
     ((sVar1 == 0 ||
      (iVar2 = bcmp((left->name_space)._M_str,(right->name_space)._M_str,sVar1), iVar2 == 0)))) {
    return true;
  }
  return false;
}

Assistant:

bool operator==(type_name const& left, type_name const& right)
    {
        return left.name == right.name && left.name_space == right.name_space;
    }